

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O2

Error __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
          (DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,
          uint64_t *OffsetPtr)

{
  undefined1 uVar1;
  uint64_t uVar2;
  pointer pRVar3;
  DWARFDataExtractor Data_00;
  ulong uVar4;
  uint64_t uVar5;
  mapped_type *this_00;
  ulong *in_RDX;
  Error *E;
  size_t in_R9;
  pointer OffsetPtr_00;
  StringRef SectionName;
  undefined1 auStack_58 [8];
  DWARFDebugRnglist CurrentList;
  uint64_t Off;
  
  clear((DWARFListTableBase<llvm::DWARFDebugRnglist> *)OffsetPtr);
  DWARFListTableHeader::extract(&this->Header,Data,OffsetPtr);
  uVar4 = (this->Header).HeaderData.Length & 0xfffffffffffffffe;
  (this->Header).HeaderData.Length = uVar4 != 0 | uVar4;
  if (uVar4 == 0) {
    Error::~Error((Error *)this);
    uVar1 = *(undefined1 *)((long)OffsetPtr + 10);
    uVar2 = OffsetPtr[6];
    uVar5 = DWARFListTableHeader::length((DWARFListTableHeader *)OffsetPtr);
    OffsetPtr_00 = (pointer)(uVar5 + uVar2);
    while( true ) {
      pRVar3 = (pointer)*in_RDX;
      if (OffsetPtr_00 <= pRVar3) break;
      CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_58 = (undefined1  [8])0x0;
      CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Data_00.super_DataExtractor.AddressSize = uVar1;
      Data_00.super_DataExtractor.IsLittleEndian = Data.super_DataExtractor.IsLittleEndian;
      Data_00.super_DataExtractor._18_6_ = Data.super_DataExtractor._18_6_;
      Data_00.super_DataExtractor.Data = Data.super_DataExtractor.Data;
      Data_00.Obj = Data.Obj;
      Data_00.Section = Data.Section;
      SectionName.Length = in_R9;
      SectionName.Data = (char *)in_RDX;
      CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pRVar3;
      DWARFListType<llvm::RangeListEntry>::extract
                ((DWARFListType<llvm::RangeListEntry> *)this,Data_00,(uint64_t)auStack_58,
                 OffsetPtr[6],(uint64_t *)OffsetPtr_00,SectionName,*(StringRef *)(OffsetPtr + 7));
      uVar4 = (this->Header).HeaderData.Length & 0xfffffffffffffffe;
      (this->Header).HeaderData.Length = uVar4 != 0 | uVar4;
      if (uVar4 != 0) {
        std::_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::
        ~_Vector_base((_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
                      auStack_58);
        return (Error)(ErrorInfoBase *)this;
      }
      Error::~Error((Error *)this);
      this_00 = std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::operator[]((map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                              *)(OffsetPtr + 0xb),
                             (key_type_conflict *)
                             &CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
                              super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::operator=
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this_00,
                 (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)auStack_58);
      std::_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::~_Vector_base
                ((_Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
                 auStack_58);
    }
    if (pRVar3 != OffsetPtr_00) {
      __assert_fail("*OffsetPtr == End && \"mismatch between expected length of table and length \" \"of extracted data\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                    ,0xd4,
                    "Error llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract(DWARFDataExtractor, uint64_t *) [DWARFListType = llvm::DWARFDebugRnglist]"
                   );
    }
    (this->Header).HeaderData.Length = 1;
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableBase<DWARFListType>::extract(DWARFDataExtractor Data,
                                                 uint64_t *OffsetPtr) {
  clear();
  if (Error E = extractHeaderAndOffsets(Data, OffsetPtr))
    return E;

  Data.setAddressSize(Header.getAddrSize());
  uint64_t End = getHeaderOffset() + Header.length();
  while (*OffsetPtr < End) {
    DWARFListType CurrentList;
    uint64_t Off = *OffsetPtr;
    if (Error E = CurrentList.extract(Data, getHeaderOffset(), End, OffsetPtr,
                                      Header.getSectionName(),
                                      Header.getListTypeString()))
      return E;
    ListMap[Off] = CurrentList;
  }

  assert(*OffsetPtr == End &&
         "mismatch between expected length of table and length "
         "of extracted data");
  return Error::success();
}